

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_status.hpp
# Opt level: O1

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator<<(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *out,
                mrg_status<int,_3,_trng::mrg3s> *S)

{
  undefined4 uVar1;
  long lVar2;
  long *plVar3;
  int i;
  long lVar4;
  wchar_t local_34;
  wchar_t local_30;
  wchar_t local_2c;
  
  lVar4 = *(long *)out;
  lVar2 = *(long *)(lVar4 + -0x18);
  uVar1 = *(undefined4 *)(out + lVar2 + 0x18);
  *(undefined4 *)(out + lVar2 + 0x18) = 0x26;
  plVar3 = *(long **)(out + *(long *)(lVar4 + -0x18) + 0xf0);
  if (plVar3 != (long *)0x0) {
    local_30 = (**(code **)(*plVar3 + 0x50))(plVar3,0x28);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)out,&local_30,1);
    lVar4 = 0;
    do {
      std::wostream::operator<<((wostream *)out,S->r[lVar4]);
      if (lVar4 != 2) {
        plVar3 = *(long **)(out + *(long *)(*(long *)out + -0x18) + 0xf0);
        if (plVar3 == (long *)0x0) goto LAB_001e0a80;
        local_34 = (**(code **)(*plVar3 + 0x50))(plVar3,0x20);
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)out,&local_34,1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    plVar3 = *(long **)(out + *(long *)(*(long *)out + -0x18) + 0xf0);
    if (plVar3 != (long *)0x0) {
      local_2c = (**(code **)(*plVar3 + 0x50))(plVar3,0x29);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)out,&local_2c,1);
      *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
      return out;
    }
  }
LAB_001e0a80:
  std::__throw_bad_cast();
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
        std::basic_ostream<char_t, traits_t> &out, const mrg_status &S) {
      std::ios_base::fmtflags flags(out.flags());
      out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      out << '(';
      for (int i{0}; i < n; ++i) {
        out << S.r[i];
        if (i + 1 < n)
          out << ' ';
      }
      out << ')';
      out.flags(flags);
      return out;
    }